

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

bool DivisionNegativeCornerCaseHelper<long_long,_unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter,_1>
     ::NegativeCornerCase
               (unsigned_long lhs,
               SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs,
               SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *result)

{
  longlong lVar1;
  div_t dVar2;
  div_t dVar3;
  longlong *in_RDX;
  int in_EDI;
  longlong minT;
  longlong maxT;
  unsigned_long tmp;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> in_stack_ffffffffffffffb0
  ;
  longlong local_48;
  longlong local_40;
  long local_38;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> local_30;
  div_t local_28;
  longlong *local_20;
  int local_18;
  
  local_20 = in_RDX;
  local_18 = in_EDI;
  lVar1 = ::SafeInt::operator_cast_to_long_long(in_stack_ffffffffffffffb0.m_int);
  dVar2 = division_negative_negateU<long_long,_unsigned_long,_false>::div((int)lVar1,local_18);
  local_28 = dVar2;
  dVar3 = (div_t)std::numeric_limits<long_long>::max();
  if ((ulong)dVar3 < (ulong)dVar2) {
    local_40 = std::numeric_limits<long_long>::max();
    if (local_28 != (div_t)(local_40 + 1)) {
      safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
    }
    local_48 = std::numeric_limits<long_long>::min();
    SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt
              ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &stack0xffffffffffffffb0,&local_48);
    *local_20 = in_stack_ffffffffffffffb0.m_int;
  }
  else {
    local_38 = ((ulong)local_28 ^ 0xffffffffffffffff) + 1;
    SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt
              (&local_30,&local_38);
    *local_20 = local_30.m_int;
  }
  return true;
}

Assistant:

SAFE_INT_NODISCARD static bool NegativeCornerCase( U lhs, SafeInt< T, E > rhs, SafeInt<T, E>& result ) SAFEINT_CPP_THROW
    {
        // Problem case - normal casting behavior changes meaning
        // flip rhs to positive
        // any operator casts now do the right thing
        U tmp = division_negative_negateU< T, U, sizeof(T) == 4>::div(rhs, lhs);

        if( tmp <= (U)std::numeric_limits<T>::max() )
        {
            result = SafeInt< T, E >( (T)(~(std::uint64_t)tmp + 1) );
            return true;
        }

        // Corner case
        T maxT = std::numeric_limits<T>::max();
        if( tmp == (U)maxT + 1 )
        {
            T minT = std::numeric_limits<T>::min();
            result = SafeInt< T, E >( minT );
            return true;
        }

        E::SafeIntOnOverflow();
    }